

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

void __thiscall sf::Font::Font(Font *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  memset(in_RDI + 5,0,0x20);
  Info::Info((Info *)0x12c307);
  std::
  map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  ::map((map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
         *)0x12c315);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12c323);
  return;
}

Assistant:

Font::Font() :
m_library  (NULL),
m_face     (NULL),
m_streamRec(NULL),
m_stroker  (NULL),
m_refCount (NULL),
m_info     ()
{
    #ifdef SFML_SYSTEM_ANDROID
        m_stream = NULL;
    #endif
}